

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h265e_vepu511.c
# Opt level: O0

void vepu511_h265_set_pp_regs
               (H265eV511RegSet *regs,VepuFmtCfg *fmt,MppEncPrepCfg *prep_cfg,HalEncTask *task)

{
  uint local_40;
  uint local_3c;
  RK_S32 stridec;
  RK_S32 stridey;
  H265eVepu511Frame *reg_frm;
  Vepu511ControlCfg *reg_ctl;
  HalEncTask *task_local;
  MppEncPrepCfg *prep_cfg_local;
  VepuFmtCfg *fmt_local;
  H265eV511RegSet *regs_local;
  
  local_3c = 0;
  (regs->reg_ctl).dtrns_map =
       (anon_struct_4_8_ec00e75a_for_dtrns_map)
       ((uint)(regs->reg_ctl).dtrns_map & 0xffffff0f | (fmt->src_endian & 0xf) << 4);
  (regs->reg_frm).common.src_fmt =
       (anon_struct_4_9_1f148558_for_src_fmt)
       ((uint)(regs->reg_frm).common.src_fmt & 0xffffffc3 |
       (fmt->format & (VEPU580_FMT_BUTT|VEPU541_FMT_BGR888)) << 2);
  (regs->reg_frm).common.src_fmt =
       (anon_struct_4_9_1f148558_for_src_fmt)
       ((uint)(regs->reg_frm).common.src_fmt & 0xfffffffe | fmt->alpha_swap & 1);
  (regs->reg_frm).common.src_fmt =
       (anon_struct_4_9_1f148558_for_src_fmt)
       ((uint)(regs->reg_frm).common.src_fmt & 0xfffffffd | (fmt->rbuv_swap & 1) << 1);
  (regs->reg_frm).common.src_fmt =
       (anon_struct_4_9_1f148558_for_src_fmt)
       ((uint)(regs->reg_frm).common.src_fmt & 0xffffff7f |
       (uint)(prep_cfg->format != MPP_FMT_YUV400) << 7);
  (regs->reg_frm).common.src_proc =
       (anon_struct_4_9_c8a120ae_for_src_proc)
       ((uint)(regs->reg_frm).common.src_proc & 0xfbffffff | (uint)(0 < prep_cfg->mirroring) << 0x1a
       );
  (regs->reg_frm).common.src_proc =
       (anon_struct_4_9_c8a120ae_for_src_proc)
       ((uint)(regs->reg_frm).common.src_proc & 0xe7ffffff |
       (prep_cfg->rotation & MPP_ENC_ROT_270) << 0x1b);
  if ((prep_cfg->format & 0xf00000) == MPP_FMT_YUV420SP) {
    if (prep_cfg->hor_stride == 0) {
      if (((uint)(regs->reg_frm).common.src_fmt >> 2 & 0xf) == 0) {
        local_3c = prep_cfg->width << 2;
      }
      else if (((uint)(regs->reg_frm).common.src_fmt >> 2 & 0xf) == 1) {
        local_3c = prep_cfg->width * 3;
      }
      else if (((((uint)(regs->reg_frm).common.src_fmt >> 2 & 0xf) == 2) ||
               (((uint)(regs->reg_frm).common.src_fmt >> 2 & 0xf) == 8)) ||
              (((uint)(regs->reg_frm).common.src_fmt >> 2 & 0xf) == 9)) {
        local_3c = prep_cfg->width << 1;
      }
    }
    else {
      local_3c = prep_cfg->hor_stride;
    }
  }
  else {
    (regs->reg_frm).common.src_proc =
         (anon_struct_4_9_c8a120ae_for_src_proc)
         ((uint)(regs->reg_frm).common.src_proc & 0xbfffffff | 0x40000000);
    local_3c = mpp_frame_get_fbc_hdr_stride(task->frame);
    if (local_3c == 0) {
      local_3c = (int)(prep_cfg->hor_stride + 0x3fU & 0xffffffc0) >> 2;
    }
  }
  switch(fmt->format) {
  case VEPU541_FMT_YUV422SP:
  case VEPU541_FMT_YUV420SP:
  case VEPU580_FMT_YUV444P:
    local_40 = local_3c;
    break;
  default:
    local_40 = (int)local_3c / 2;
    break;
  case VEPU580_FMT_YUV444SP:
    local_40 = local_3c << 1;
  }
  if (((uint)(regs->reg_frm).common.src_fmt >> 2 & 0xf) < 3) {
    (regs->reg_frm).common.src_udfy =
         (anon_struct_4_4_5bca4cfa_for_src_udfy)
         ((uint)(regs->reg_frm).common.src_udfy & 0xf803ffff | 0x1340000);
    (regs->reg_frm).common.src_udfy =
         (anon_struct_4_4_5bca4cfa_for_src_udfy)
         ((uint)(regs->reg_frm).common.src_udfy & 0xfffc01ff | 0x12c00);
    (regs->reg_frm).common.src_udfy =
         (anon_struct_4_4_5bca4cfa_for_src_udfy)
         ((uint)(regs->reg_frm).common.src_udfy & 0xfffffe00 | 0x1d);
    (regs->reg_frm).common.src_udfu =
         (anon_struct_4_4_5bc86bfe_for_src_udfu)
         ((uint)(regs->reg_frm).common.src_udfu & 0xf803ffff | 0x7540000);
    (regs->reg_frm).common.src_udfu =
         (anon_struct_4_4_5bc86bfe_for_src_udfu)
         ((uint)(regs->reg_frm).common.src_udfu & 0xfffc01ff | 0x35600);
    (regs->reg_frm).common.src_udfu =
         (anon_struct_4_4_5bc86bfe_for_src_udfu)
         ((uint)(regs->reg_frm).common.src_udfu & 0xfffffe00 | 0x80);
    (regs->reg_frm).common.src_udfv =
         (anon_struct_4_4_5bc8e43d_for_src_udfv)
         ((uint)(regs->reg_frm).common.src_udfv & 0xf803ffff | 0x2000000);
    (regs->reg_frm).common.src_udfv =
         (anon_struct_4_4_5bc8e43d_for_src_udfv)
         ((uint)(regs->reg_frm).common.src_udfv & 0xfffc01ff | 0x32a00);
    (regs->reg_frm).common.src_udfv =
         (anon_struct_4_4_5bc8e43d_for_src_udfv)
         ((uint)(regs->reg_frm).common.src_udfv & 0xfffffe00 | 0x1eb);
    (regs->reg_frm).common.src_udfo =
         (anon_struct_4_4_3bda6cac_for_src_udfo)((uint)(regs->reg_frm).common.src_udfo & 0xffe0ffff)
    ;
    (regs->reg_frm).common.src_udfo =
         (anon_struct_4_4_3bda6cac_for_src_udfo)
         ((uint)(regs->reg_frm).common.src_udfo & 0xffff00ff | 0x8000);
    (regs->reg_frm).common.src_udfo =
         (anon_struct_4_4_3bda6cac_for_src_udfo)
         ((uint)(regs->reg_frm).common.src_udfo & 0xffffff00 | 0x80);
  }
  (regs->reg_frm).common.src_strd0 =
       (anon_struct_4_2_9e7912bd_for_src_strd0)
       ((uint)(regs->reg_frm).common.src_strd0 & 0xffe00000 | local_3c & 0x1fffff);
  (regs->reg_frm).common.src_strd1 =
       (anon_struct_4_2_9e7912be_for_src_strd1)
       ((uint)(regs->reg_frm).common.src_strd1 & 0xffff0000 | local_40 & 0xffff);
  return;
}

Assistant:

static void vepu511_h265_set_pp_regs(H265eV511RegSet *regs, VepuFmtCfg *fmt,
                                     MppEncPrepCfg *prep_cfg, HalEncTask *task)
{
    Vepu511ControlCfg *reg_ctl = &regs->reg_ctl;
    H265eVepu511Frame *reg_frm = &regs->reg_frm;
    RK_S32 stridey = 0;
    RK_S32 stridec = 0;

    reg_ctl->dtrns_map.src_bus_edin = fmt->src_endian;
    reg_frm->common.src_fmt.src_cfmt = fmt->format;
    reg_frm->common.src_fmt.alpha_swap = fmt->alpha_swap;
    reg_frm->common.src_fmt.rbuv_swap = fmt->rbuv_swap;

    reg_frm->common.src_fmt.out_fmt = (prep_cfg->format == MPP_FMT_YUV400) ? 0 : 1;

    reg_frm->common.src_proc.src_mirr = prep_cfg->mirroring > 0;
    reg_frm->common.src_proc.src_rot = prep_cfg->rotation;

    if (MPP_FRAME_FMT_IS_FBC(prep_cfg->format)) {
        reg_frm->common.src_proc.rkfbcd_en = 1;

        stridey = mpp_frame_get_fbc_hdr_stride(task->frame);
        if (!stridey)
            stridey = MPP_ALIGN(prep_cfg->hor_stride, 64) >> 2;
    } else if (prep_cfg->hor_stride)
        stridey = prep_cfg->hor_stride;
    else {
        if (reg_frm->common.src_fmt.src_cfmt == VEPU541_FMT_BGRA8888 )
            stridey = prep_cfg->width * 4;
        else if (reg_frm->common.src_fmt.src_cfmt == VEPU541_FMT_BGR888 )
            stridey = prep_cfg->width * 3;
        else if (reg_frm->common.src_fmt.src_cfmt == VEPU541_FMT_BGR565 ||
                 reg_frm->common.src_fmt.src_cfmt == VEPU541_FMT_YUYV422 ||
                 reg_frm->common.src_fmt.src_cfmt == VEPU541_FMT_UYVY422)
            stridey = prep_cfg->width * 2;
    }

    switch (fmt->format) {
    case VEPU580_FMT_YUV444SP : {
        stridec = stridey * 2;
    } break;
    case VEPU541_FMT_YUV422SP :
    case VEPU541_FMT_YUV420SP :
    case VEPU580_FMT_YUV444P : {
        stridec = stridey;
    } break;
    default : {
        stridec = stridey / 2;
    } break;
    }

    if (reg_frm->common.src_fmt.src_cfmt < VEPU541_FMT_NONE) {
        reg_frm->common.src_udfy.csc_wgt_r2y = 77;
        reg_frm->common.src_udfy.csc_wgt_g2y = 150;
        reg_frm->common.src_udfy.csc_wgt_b2y = 29;

        reg_frm->common.src_udfu.csc_wgt_r2u = -43;
        reg_frm->common.src_udfu.csc_wgt_g2u = -85;
        reg_frm->common.src_udfu.csc_wgt_b2u = 128;

        reg_frm->common.src_udfv.csc_wgt_r2v = 128;
        reg_frm->common.src_udfv.csc_wgt_g2v = -107;
        reg_frm->common.src_udfv.csc_wgt_b2v = -21;

        reg_frm->common.src_udfo.csc_ofst_y = 0;
        reg_frm->common.src_udfo.csc_ofst_u = 128;
        reg_frm->common.src_udfo.csc_ofst_v = 128;
    }

    reg_frm->common.src_strd0.src_strd0  = stridey;
    reg_frm->common.src_strd1.src_strd1  = stridec;
}